

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O1

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>::
CalculateQ(ChContactSMC<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_> *this
          ,ChState *stateA_x,ChStateDelta *stateA_w,ChState *stateB_x,ChStateDelta *stateB_w,
          ChMaterialCompositeSMC *mat,ChVectorDynamic<> *Q)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChContactable_3vars<6,_6,_6> *pCVar3;
  ChContactable_1vars<3> *pCVar4;
  undefined8 uVar5;
  bool bVar6;
  ChState *pCVar7;
  uint uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ChVector<double> p2_abs;
  ChVector<double> p1_abs;
  ChVector<double> vel1;
  ChVector<double> p2_loc;
  ChVector<double> p1_loc;
  ChVector<double> force;
  ChVector<double> vel2;
  ChVector<double> local_170;
  double local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  double local_138;
  ChStateDelta *local_130;
  ChStateDelta *local_128;
  ChMaterialCompositeSMC *local_120;
  ChState *local_118;
  double local_110;
  double local_108;
  double local_100;
  ChCoordsys<double> local_f8;
  ChVector<double> local_c0;
  undefined1 local_a8 [24];
  undefined1 local_90 [24];
  undefined1 local_78 [16];
  undefined8 local_68;
  ChVector<double> local_60;
  ChVector<double> local_48;
  undefined1 extraout_var [56];
  
  local_130 = stateA_w;
  local_128 = stateB_w;
  local_120 = mat;
  (*(((this->
      super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>).
     objA)->super_ChContactable)._vptr_ChContactable[0xb])(&local_f8);
  ChCoordsys<double>::TransformPointParentToLocal
            (&local_f8,
             &(this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
              ).p1);
  (*(((this->
      super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>).
     objB)->super_ChContactable)._vptr_ChContactable[0xb])(&local_f8);
  ChCoordsys<double>::TransformPointParentToLocal
            (&local_f8,
             &(this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
              ).p2);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
           ).objA;
  local_118 = stateA_x;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[8])(&local_f8,pCVar3,local_90,stateA_x);
  pCVar4 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
           ).objB;
  (*(pCVar4->super_ChContactable)._vptr_ChContactable[8])(&local_110,pCVar4,local_a8,stateB_x);
  local_170.m_data[0] = local_f8.pos.m_data[0] - local_110;
  local_170.m_data[1] = local_f8.pos.m_data[1] - local_108;
  local_170.m_data[2] = local_f8.pos.m_data[2] - local_100;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_170.m_data[1] * local_170.m_data[1];
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_170.m_data[0];
  auVar10 = vfmadd231sd_fma(auVar10,auVar20,auVar20);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_170.m_data[2];
  auVar10 = vfmadd231sd_fma(auVar10,auVar19,auVar19);
  if (auVar10._0_8_ < 0.0) {
    local_158 = local_170.m_data[2];
    local_148 = local_170.m_data[1];
    local_138 = local_170.m_data[0];
    dVar9 = sqrt(auVar10._0_8_);
    local_170.m_data[0] = local_138;
    local_170.m_data[1] = local_148;
    local_170.m_data[2] = local_158;
  }
  else {
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    dVar9 = auVar10._0_8_;
  }
  if (dVar9 < 2.2250738585072014e-308) {
    local_170.m_data[0] = 1.0;
    local_170.m_data[1] = 0.0;
    local_170.m_data[2] = 0.0;
  }
  else {
    dVar9 = 1.0 / dVar9;
    local_170.m_data[0] = local_170.m_data[0] * dVar9;
    local_170.m_data[1] = local_170.m_data[1] * dVar9;
    local_170.m_data[2] = local_170.m_data[2] * dVar9;
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (local_f8.pos.m_data[1] - local_108) * (local_f8.pos.m_data[1] - local_108);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_f8.pos.m_data[0] - local_110;
  auVar10 = vfmadd231sd_fma(auVar11,auVar16,auVar16);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_f8.pos.m_data[2] - local_100;
  auVar10 = vfmadd231sd_fma(auVar10,auVar14,auVar14);
  if (auVar10._0_8_ < 0.0) {
    auVar13._0_8_ = sqrt(auVar10._0_8_);
    auVar13._8_56_ = extraout_var;
    auVar10 = auVar13._0_16_;
  }
  else {
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
  }
  pCVar7 = local_118;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_170.m_data[0];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->
                 super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
                 ).normal.m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       local_170.m_data[1] *
       (this->
       super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>).
       normal.m_data[1];
  auVar19 = vfmadd231sd_fma(auVar15,auVar17,auVar1);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_170.m_data[2];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (this->
                 super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
                 ).normal.m_data[2];
  auVar19 = vfmadd132sd_fma(auVar18,auVar19,auVar2);
  local_148 = -0.0;
  uStack_140 = 0x8000000000000000;
  uStack_150 = auVar10._8_8_;
  uVar5 = vcmpsd_avx512f(auVar19,ZEXT816(0) << 0x40,1);
  bVar6 = (bool)((byte)uVar5 & 1);
  local_158 = (double)((ulong)bVar6 * (auVar10._0_8_ ^ 0x8000000000000000) +
                      (ulong)!bVar6 * auVar10._0_8_);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
           ).objA;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[9])
            (&local_c0,pCVar3,local_90,local_118,local_130);
  pCVar4 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
           ).objB;
  (*(pCVar4->super_ChContactable)._vptr_ChContactable[9])
            (&local_48,pCVar4,local_a8,stateB_x,local_128);
  CalculateForce(&local_60,this,local_158,&local_170,&local_c0,&local_48,local_120);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
           ).objA;
  auVar12._0_4_ = SUB84(local_60.m_data[2],0) ^ (uint)local_148;
  auVar12._4_4_ = (uint)((ulong)local_60.m_data[2] >> 0x20) ^ local_148._4_4_;
  auVar12._8_4_ = (uint)uStack_140;
  auVar12._12_4_ = uStack_140._4_4_;
  local_78._0_4_ = (uint)local_148 ^ local_60.m_data[0]._0_4_;
  local_78._4_4_ = local_148._4_4_ ^ local_60.m_data[0]._4_4_;
  local_78._8_4_ = (uint)uStack_140 ^ local_60.m_data[1]._0_4_;
  local_78._12_4_ = uStack_140._4_4_ ^ local_60.m_data[1]._4_4_;
  local_68 = vmovlps_avx(auVar12);
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[0xd])(pCVar3,local_78,&local_f8,pCVar7,Q,0);
  pCVar4 = (this->
           super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
           ).objB;
  uVar8 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_3vars<6,_6,_6>,_chrono::ChContactable_1vars<3>_>
              ).objA)->super_ChContactable)._vptr_ChContactable[4])();
  (*(pCVar4->super_ChContactable)._vptr_ChContactable[0xd])
            (pCVar4,&local_60,&local_110,stateB_x,Q,(ulong)uVar8);
  return;
}

Assistant:

void CalculateQ(const ChState& stateA_x,            ///< state positions for objA
                    const ChStateDelta& stateA_w,       ///< state velocities for objA
                    const ChState& stateB_x,            ///< state positions for objB
                    const ChStateDelta& stateB_w,       ///< state velocities for objB
                    const ChMaterialCompositeSMC& mat,  ///< composite material for contact pair
                    ChVectorDynamic<>& Q                ///< output generalized forces
    ) {
        // Express contact points in local frames.
        // We assume that these points remain fixed to their respective contactable objects.
        ChVector<> p1_loc = this->objA->GetCsysForCollisionModel().TransformPointParentToLocal(this->p1);
        ChVector<> p2_loc = this->objB->GetCsysForCollisionModel().TransformPointParentToLocal(this->p2);

        // Express the local points in global frame
        ChVector<> p1_abs = this->objA->GetContactPoint(p1_loc, stateA_x);
        ChVector<> p2_abs = this->objB->GetContactPoint(p2_loc, stateB_x);

        /*
            Note: while this can be somewhat justified for a ChBody, it will not work
                  for a mesh vertex for instance...

        // Project the points onto the unperturbed normal line
        p1_abs = this->p1 + Vdot(p1_abs - this->p1, this->normal) * this->normal;
        p2_abs = this->p2 + Vdot(p2_abs - this->p2, this->normal) * this->normal;
        */

        // Calculate normal direction (expressed in global frame)
        ChVector<> normal_dir = (p1_abs - p2_abs).GetNormalized();

        // Calculate penetration depth
        double delta = (p1_abs - p2_abs).Length();

        // If the normal direction flipped sign, change sign of delta
        if (Vdot(normal_dir, this->normal) < 0)
            delta = -delta;

        // Calculate velocity of contact points (expressed in global frame)
        ChVector<> vel1 = this->objA->GetContactPointSpeed(p1_loc, stateA_x, stateA_w);
        ChVector<> vel2 = this->objB->GetContactPointSpeed(p2_loc, stateB_x, stateB_w);

        // Compute the contact force.
        ChVector<> force = CalculateForce(delta, normal_dir, vel1, vel2, mat);

        // Compute and load the generalized contact forces.
        this->objA->ContactForceLoadQ(-force, p1_abs, stateA_x, Q, 0);
        this->objB->ContactForceLoadQ(force, p2_abs, stateB_x, Q, this->objA->ContactableGet_ndof_w());
    }